

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Function::dump(Function *this,Vector<unsigned_int> *out)

{
  Block *root;
  int iVar1;
  size_type sVar2;
  const_reference ppIVar3;
  const_reference ppBVar4;
  undefined1 local_90 [8];
  Instruction end;
  anon_class_8_1_ba1d6aae local_48;
  function<void_(spv::Block_*)> local_40;
  int local_1c;
  Vector<unsigned_int> *pVStack_18;
  int p;
  Vector<unsigned_int> *out_local;
  Function *this_local;
  
  pVStack_18 = out;
  out_local = (Vector<unsigned_int> *)this;
  Instruction::dump(&this->functionInstruction,out);
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    sVar2 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
            size(&this->parameterInstructions);
    if ((int)sVar2 <= iVar1) break;
    ppIVar3 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              operator[](&this->parameterInstructions,(long)local_1c);
    Instruction::dump(*ppIVar3,pVStack_18);
    local_1c = local_1c + 1;
  }
  ppBVar4 = std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::operator[]
                      (&this->blocks,0);
  root = *ppBVar4;
  local_48.out = pVStack_18;
  std::function<void(spv::Block*)>::
  function<spv::Function::dump(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>&)const::_lambda(spv::Block_const*)_1_,void>
            ((function<void(spv::Block*)> *)&local_40,&local_48);
  inReadableOrder(root,&local_40);
  std::function<void_(spv::Block_*)>::~function(&local_40);
  Instruction::Instruction((Instruction *)local_90,0,0,OpFunctionEnd);
  Instruction::dump((Instruction *)local_90,pVStack_18);
  Instruction::~Instruction((Instruction *)local_90);
  return;
}

Assistant:

void dump(dxil_spv::Vector<unsigned int>& out) const
    {
        // OpFunction
        functionInstruction.dump(out);

        // OpFunctionParameter
        for (int p = 0; p < (int)parameterInstructions.size(); ++p)
            parameterInstructions[p]->dump(out);

        // Blocks
        inReadableOrder(blocks[0], [&out](const Block* b) { b->dump(out); });
        Instruction end(0, 0, OpFunctionEnd);
        end.dump(out);
    }